

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

Formats * __thiscall
deqp::gls::FboUtil::FormatDB::getFormats
          (Formats *__return_storage_ptr__,FormatDB *this,FormatFlags requirements)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (this->m_formatFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_formatFlags)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if ((requirements & ~*(uint *)&p_Var2[1]._M_parent) == ANY_FORMAT) {
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
      ::_M_insert_unique<deqp::gls::FboUtil::ImageFormat_const&>
                ((_Rb_tree<deqp::gls::FboUtil::ImageFormat,deqp::gls::FboUtil::ImageFormat,std::_Identity<deqp::gls::FboUtil::ImageFormat>,std::less<deqp::gls::FboUtil::ImageFormat>,std::allocator<deqp::gls::FboUtil::ImageFormat>>
                  *)__return_storage_ptr__,(ImageFormat *)(p_Var2 + 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Formats FormatDB::getFormats (FormatFlags requirements) const
{
	Formats ret;
	for (FormatMap::const_iterator it = m_formatFlags.begin(); it != m_formatFlags.end(); it++)
	{
		if ((it->second & requirements) == requirements)
			ret.insert(it->first);
	}
	return ret;
}